

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

void P_Recalculate3DFloors(sector_t_conflict *sector)

{
  byte *pbVar1;
  TArray<lightlist_t,_lightlist_t> *this;
  uint *puVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  extsector_t *peVar7;
  secplane_t *psVar8;
  lightlist_t *plVar9;
  FTextureID *pFVar10;
  sector_t *psVar11;
  undefined7 uVar12;
  int iVar13;
  int iVar14;
  F3DFloor *pFVar15;
  F3DFloor *pFVar16;
  FDynamicColormap *pFVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  F3DFloor *__src;
  uint32 uVar21;
  TArray<F3DFloor_*,_F3DFloor_*> *other;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  TArray<F3DFloor_*,_F3DFloor_*> oldlist;
  F3DFloor *local_c8;
  double local_c0;
  double local_b8;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_ac;
  TArray<F3DFloor_*,_F3DFloor_*> local_a8;
  double local_90;
  double local_88;
  double local_80;
  short *local_78;
  FDynamicColormap *local_70;
  F3DFloor *local_68;
  TArray<F3DFloor_*,_F3DFloor_*> *local_60;
  double local_58;
  double dStack_50;
  short *local_48;
  FDynamicColormap *local_40;
  short *local_38;
  
  peVar7 = sector->e;
  other = (TArray<F3DFloor_*,_F3DFloor_*> *)&peVar7->XFloor;
  local_60 = other;
  if (1 < (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count) {
    local_a8.Array = (F3DFloor **)0x0;
    local_a8.Most = 0;
    local_a8.Count = 0;
    TArray<F3DFloor_*,_F3DFloor_*>::operator=(&local_a8,other);
    if ((peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = 0;
    }
    if (local_a8.Count != 0) {
      uVar22 = 0;
      do {
        uVar19 = (uint)uVar22;
        pFVar15 = local_a8.Array[uVar22];
        uVar18 = pFVar15->flags;
        if ((uVar18 >> 0x17 & 1) == 0) {
          if ((uVar18 >> 0x18 & 1) != 0) {
            pFVar15->flags = (uVar18 & 0xfe7ffffe) + 1;
          }
          uVar22 = (ulong)(uVar19 + 1);
        }
        else {
          if (pFVar15 != (F3DFloor *)0x0) {
            operator_delete(pFVar15,0x98);
          }
          if (uVar19 < local_a8.Count) {
            uVar18 = local_a8.Count - 1;
            local_a8.Count = uVar18;
            if (uVar19 <= uVar18 && uVar18 - uVar19 != 0) {
              memmove(local_a8.Array + uVar22,local_a8.Array + uVar22 + 1,
                      (ulong)(uVar18 - uVar19) << 3);
            }
          }
        }
      } while ((uint)uVar22 < local_a8.Count);
    }
    other = local_60;
    if (local_a8.Count != 0) {
      local_c0 = 0.0;
      local_c8 = (F3DFloor *)0x0;
      local_b8 = 0.0;
      pFVar15 = (F3DFloor *)0x0;
      do {
        __src = *local_a8.Array;
        psVar8 = (__src->top).plane;
        dVar23 = (sector->centerspot).X;
        dVar4 = (sector->centerspot).Y;
        dVar24 = ((psVar8->normal).Y * dVar4 + (psVar8->normal).X * dVar23 + psVar8->D) *
                 psVar8->negiC;
        if (local_a8.Count < 2) {
          uVar18 = 0;
        }
        else {
          uVar22 = 0;
          uVar20 = 1;
          do {
            psVar8 = (local_a8.Array[uVar20]->top).plane;
            dVar25 = ((psVar8->normal).Y * dVar4 + (psVar8->normal).X * dVar23 + psVar8->D) *
                     psVar8->negiC;
            if (dVar24 < dVar25) {
              uVar22 = uVar20 & 0xffffffff;
              __src = local_a8.Array[uVar20];
            }
            uVar18 = (uint)uVar22;
            if (dVar25 <= dVar24) {
              dVar25 = dVar24;
            }
            dVar24 = dVar25;
            uVar20 = uVar20 + 1;
          } while (local_a8.Count != uVar20);
        }
        if (uVar18 < local_a8.Count) {
          uVar19 = local_a8.Count - 1;
          local_a8.Count = uVar19;
          if (uVar18 <= uVar19 && uVar19 - uVar18 != 0) {
            memmove(local_a8.Array + uVar18,local_a8.Array + (uVar18 + 1),
                    (ulong)(uVar19 - uVar18) << 3);
          }
        }
        uVar18 = __src->flags;
        pFVar16 = pFVar15;
        if ((uVar18 >> 0x1e & 1) == 0) {
          psVar8 = (__src->bottom).plane;
          dVar23 = ((psVar8->normal).Y * (sector->centerspot).Y +
                   (psVar8->normal).X * (sector->centerspot).X + psVar8->D) * psVar8->negiC;
          if (((uVar18 & 1) == 0) || ((uVar18 & 0x810) == 0 && (uVar18 & 0xc) != 0)) {
            if ((pFVar15 == (F3DFloor *)0x0) || (dVar24 <= local_b8)) {
              TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
              pFVar15 = __src;
              if (local_c0 <= dVar23 && local_c8 != (F3DFloor *)0x0) {
                dVar23 = local_c0;
                pFVar15 = local_c8;
              }
              uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = __src;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
              local_c8 = pFVar15;
              local_c0 = dVar23;
            }
            else {
              pFVar16 = (F3DFloor *)operator_new(0x98);
              memcpy(pFVar16,pFVar15,0x98);
              pFVar15->flags = pFVar15->flags & 0xfefffffe | 0x1000000;
              pbVar1 = (byte *)((long)&pFVar16->flags + 2);
              *pbVar1 = *pbVar1 | 0x80;
              uVar12 = *(undefined7 *)&(__src->top).field_0x21;
              (pFVar16->bottom).copied = (__src->top).copied;
              *(undefined7 *)&(pFVar16->bottom).field_0x21 = uVar12;
              pFVar10 = (__src->top).texture;
              psVar11 = (__src->top).model;
              iVar13 = (__src->top).isceiling;
              iVar14 = (__src->top).vindex;
              (pFVar16->bottom).plane = (__src->top).plane;
              (pFVar16->bottom).texture = pFVar10;
              (pFVar16->bottom).model = psVar11;
              (pFVar16->bottom).isceiling = iVar13;
              (pFVar16->bottom).vindex = iVar14;
              (pFVar16->bottom).copied = true;
              TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
              uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = pFVar16;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
              TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
              uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = __src;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
              local_c8 = __src;
              local_c0 = dVar23;
              if (local_b8 < dVar23) {
                pFVar16 = (F3DFloor *)operator_new(0x98);
                memcpy(pFVar16,pFVar15,0x98);
                pFVar16->flags = pFVar16->flags | 0x800001;
                uVar12 = *(undefined7 *)&(__src->bottom).field_0x21;
                (pFVar16->top).copied = (__src->bottom).copied;
                *(undefined7 *)&(pFVar16->top).field_0x21 = uVar12;
                pFVar10 = (__src->bottom).texture;
                psVar11 = (__src->bottom).model;
                iVar13 = (__src->bottom).isceiling;
                iVar14 = (__src->bottom).vindex;
                (pFVar16->top).plane = (__src->bottom).plane;
                (pFVar16->top).texture = pFVar10;
                (pFVar16->top).model = psVar11;
                (pFVar16->top).isceiling = iVar13;
                (pFVar16->top).vindex = iVar14;
                (pFVar16->top).copied = true;
                TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
                uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] =
                     pFVar16;
                (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
                goto LAB_003ab449;
              }
            }
            pFVar16 = (F3DFloor *)0x0;
          }
          else if ((local_c8 == (F3DFloor *)0x0) || (dVar24 <= local_c0)) {
            if (dVar24 < dVar23) {
              pFVar15 = (F3DFloor *)operator_new(0x98);
              memcpy(pFVar15,__src,0x98);
              __src->flags = __src->flags & 0xfefffffe | 0x1000000;
              pbVar1 = (byte *)((long)&pFVar15->flags + 2);
              *pbVar1 = *pbVar1 | 0x80;
              uVar12 = *(undefined7 *)&(__src->top).field_0x21;
              (pFVar15->bottom).copied = (__src->top).copied;
              *(undefined7 *)&(pFVar15->bottom).field_0x21 = uVar12;
              pFVar10 = (__src->top).texture;
              psVar11 = (__src->top).model;
              iVar13 = (__src->top).isceiling;
              iVar14 = (__src->top).vindex;
              (pFVar15->bottom).plane = (__src->top).plane;
              (pFVar15->bottom).texture = pFVar10;
              (pFVar15->bottom).model = psVar11;
              (pFVar15->bottom).isceiling = iVar13;
              (pFVar15->bottom).vindex = iVar14;
              (pFVar15->bottom).copied = true;
              TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
              uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = __src;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
              TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
              uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = pFVar15;
              goto LAB_003ab128;
            }
            TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
            uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = __src;
            (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
            pFVar16 = __src;
            local_b8 = dVar23;
          }
          else {
            TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
            uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = __src;
            (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
            if (dVar23 <= local_c0) {
              pFVar16 = (F3DFloor *)operator_new(0x98);
              memcpy(pFVar16,__src,0x98);
              __src->flags = __src->flags & 0xfefffffe | 0x1000000;
              pbVar1 = (byte *)((long)&pFVar16->flags + 2);
              *pbVar1 = *pbVar1 | 0x80;
              uVar12 = *(undefined7 *)&(local_c8->bottom).field_0x21;
              (pFVar16->top).copied = (local_c8->bottom).copied;
              *(undefined7 *)&(pFVar16->top).field_0x21 = uVar12;
              pFVar10 = (local_c8->bottom).texture;
              psVar11 = (local_c8->bottom).model;
              iVar13 = (local_c8->bottom).isceiling;
              iVar14 = (local_c8->bottom).vindex;
              (pFVar16->top).plane = (local_c8->bottom).plane;
              (pFVar16->top).texture = pFVar10;
              (pFVar16->top).model = psVar11;
              (pFVar16->top).isceiling = iVar13;
              (pFVar16->top).vindex = iVar14;
              (pFVar16->top).copied = true;
              TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
              uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = pFVar16;
              (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
              local_b8 = dVar23;
            }
            else {
              __src->flags = __src->flags & 0xfefffffe | 0x1000000;
            }
          }
        }
        else {
          TArray<F3DFloor_*,_F3DFloor_*>::Grow(other,1);
          uVar18 = (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18] = __src;
LAB_003ab128:
          (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar18 + 1;
        }
LAB_003ab449:
        pFVar15 = pFVar16;
      } while (local_a8.Count != 0);
    }
    TArray<F3DFloor_*,_F3DFloor_*>::~TArray(&local_a8);
  }
  if ((peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    this = &(peVar7->XFloor).lightlist;
    TArray<lightlist_t,_lightlist_t>::Resize(this,1);
    plVar9 = (peVar7->XFloor).lightlist.Array;
    (plVar9->plane).normal.Z = (sector->ceilingplane).normal.Z;
    (plVar9->plane).normal.Y = (sector->ceilingplane).normal.Y;
    (plVar9->plane).normal.X = (sector->ceilingplane).normal.X;
    dVar23 = (sector->ceilingplane).negiC;
    (plVar9->plane).D = (sector->ceilingplane).D;
    (plVar9->plane).negiC = dVar23;
    local_48 = &sector->lightlevel;
    plVar9 = (peVar7->XFloor).lightlist.Array;
    plVar9->p_lightlevel = local_48;
    plVar9->lightsource = (F3DFloor *)0x0;
    plVar9->caster = (F3DFloor *)0x0;
    plVar9->extra_colormap = sector->ColorMap;
    (plVar9->blend).field_0.d = 0;
    plVar9 = (peVar7->XFloor).lightlist.Array;
    plVar9->flags = 0;
    if ((peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      dVar23 = (sector->centerspot).X;
      dVar4 = (sector->centerspot).Y;
      dVar24 = ((sector->ceilingplane).normal.Y * dVar4 +
               (sector->ceilingplane).normal.X * dVar23 + (sector->ceilingplane).D) *
               (sector->ceilingplane).negiC;
      dVar23 = (dVar4 * (sector->floorplane).normal.Y +
               dVar23 * (sector->floorplane).normal.X + (sector->floorplane).D) *
               (sector->floorplane).negiC;
      local_68 = plVar9->lightsource;
      local_ac = (plVar9->blend).field_0;
      local_78 = plVar9->p_lightlevel;
      local_70 = plVar9->extra_colormap;
      uVar22 = 0;
      do {
        pFVar15 = (((TDeletingArray<F3DFloor_*,_F3DFloor_*> *)&other->Array)->
                  super_TArray<F3DFloor_*,_F3DFloor_*>).Array[uVar22];
        if ((pFVar15->flags & 0x21) == 1) {
          psVar8 = (pFVar15->top).plane;
          dVar4 = (psVar8->normal).X;
          dVar25 = (psVar8->normal).Y;
          dVar5 = (sector->centerspot).X;
          dVar6 = (sector->centerspot).Y;
          dVar26 = (dVar25 * dVar6 + dVar4 * dVar5 + psVar8->D) * psVar8->negiC;
          if (dVar23 <= dVar26) {
            if (dVar24 <= dVar26) {
              psVar8 = (pFVar15->bottom).plane;
              if ((dVar6 * (psVar8->normal).Y + dVar5 * (psVar8->normal).X + psVar8->D) *
                  psVar8->negiC < dVar24) {
                plVar9 = this->Array;
                plVar9->p_lightlevel = pFVar15->toplightlevel;
                plVar9->caster = pFVar15;
                plVar9->lightsource = pFVar15;
                pFVar17 = F3DFloor::GetColormap(pFVar15);
                plVar9 = this->Array;
                plVar9->extra_colormap = pFVar17;
                if (((pFVar15->flags & 0x8000000) != 0) ||
                   (uVar21 = (pFVar15->model->ColorMap->Fade).field_0.d,
                   (pFVar15->target->ColorMap->Fade).field_0.d == uVar21)) {
                  uVar21 = 0;
                }
                (plVar9->blend).field_0.d = uVar21;
                this->Array->flags = pFVar15->flags;
              }
            }
            else {
              local_90 = (psVar8->normal).Z;
              local_58 = psVar8->D;
              dStack_50 = psVar8->negiC;
              local_38 = pFVar15->toplightlevel;
              local_88 = dVar25;
              local_80 = dVar4;
              local_40 = F3DFloor::GetColormap(pFVar15);
              uVar18 = pFVar15->flags;
              if (((uVar18 >> 0x1b & 1) != 0) ||
                 (uVar21 = (pFVar15->model->ColorMap->Fade).field_0.d,
                 (pFVar15->target->ColorMap->Fade).field_0.d == uVar21)) {
                uVar21 = 0;
              }
              TArray<lightlist_t,_lightlist_t>::Grow(this,1);
              plVar9 = (peVar7->XFloor).lightlist.Array;
              uVar19 = (peVar7->XFloor).lightlist.Count;
              plVar9[uVar19].plane.normal.X = local_80;
              plVar9[uVar19].plane.normal.Y = local_88;
              plVar9[uVar19].plane.normal.Z = local_90;
              pdVar3 = &plVar9[uVar19].plane.D;
              *pdVar3 = local_58;
              pdVar3[1] = dStack_50;
              plVar9[uVar19].p_lightlevel = local_38;
              plVar9[uVar19].extra_colormap = local_40;
              plVar9[uVar19].blend.field_0.d = uVar21;
              plVar9[uVar19].flags = uVar18;
              plVar9[uVar19].lightsource = pFVar15;
              plVar9[uVar19].caster = pFVar15;
              puVar2 = &(peVar7->XFloor).lightlist.Count;
              *puVar2 = *puVar2 + 1;
              other = local_60;
            }
            uVar18 = pFVar15->flags;
            if ((uVar18 & 0x80010000) == 0) {
              plVar9 = (peVar7->XFloor).lightlist.Array;
              uVar19 = (peVar7->XFloor).lightlist.Count - 1;
              local_78 = plVar9[uVar19].p_lightlevel;
              local_70 = plVar9[uVar19].extra_colormap;
              local_ac = plVar9[uVar19].blend.field_0;
              local_68 = plVar9[uVar19].lightsource;
            }
            else if ((int)uVar18 < 0) {
              local_70 = sector->ColorMap;
              local_68 = (F3DFloor *)0x0;
              local_ac.d = 0;
              local_78 = local_48;
            }
            if ((uVar18 >> 0x10 & 1) != 0) {
              psVar8 = (pFVar15->bottom).plane;
              dVar4 = (psVar8->normal).X;
              dVar25 = (psVar8->normal).Y;
              dVar5 = ((sector->centerspot).Y * dVar25 + (sector->centerspot).X * dVar4 + psVar8->D)
                      * psVar8->negiC;
              if ((dVar5 < dVar24) && (dVar23 < dVar5)) {
                local_80 = (psVar8->normal).Z;
                local_58 = psVar8->D;
                dStack_50 = psVar8->negiC;
                local_90 = dVar4;
                local_88 = dVar25;
                TArray<lightlist_t,_lightlist_t>::Grow(this,1);
                plVar9 = (peVar7->XFloor).lightlist.Array;
                uVar19 = (peVar7->XFloor).lightlist.Count;
                plVar9[uVar19].plane.normal.X = local_90;
                plVar9[uVar19].plane.normal.Y = local_88;
                plVar9[uVar19].plane.normal.Z = local_80;
                pdVar3 = &plVar9[uVar19].plane.D;
                *pdVar3 = local_58;
                pdVar3[1] = dStack_50;
                plVar9[uVar19].p_lightlevel = local_78;
                plVar9[uVar19].extra_colormap = local_70;
                plVar9[uVar19].blend.field_0 = local_ac;
                plVar9[uVar19].flags = uVar18;
                plVar9[uVar19].lightsource = local_68;
                plVar9[uVar19].caster = pFVar15;
                puVar2 = &(peVar7->XFloor).lightlist.Count;
                *puVar2 = *puVar2 + 1;
              }
            }
          }
          if (dVar26 < dVar23) {
            return;
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < (peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
    }
  }
  return;
}

Assistant:

void P_Recalculate3DFloors(sector_t * sector)
{
	F3DFloor *		rover;
	F3DFloor *		pick;
	unsigned		pickindex;
	F3DFloor *		clipped=NULL;
	F3DFloor *		solid=NULL;
	double			solid_bottom=0;
	double			clipped_top;
	double			clipped_bottom=0;
	double			maxheight, minheight;
	unsigned		i, j;
	lightlist_t newlight;
	lightlist_t resetlight;	// what it goes back to after FF_DOUBLESHADOW

	TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;
	TArray<lightlist_t> & lightlist = sector->e->XFloor.lightlist;

	// Sort the floors top to bottom for quicker access here and later
	// Translucent and swimmable floors are split if they overlap with solid ones.
	if (ffloors.Size()>1)
	{
		TArray<F3DFloor*> oldlist;
		
		oldlist = ffloors;
		ffloors.Clear();

		// first delete the old dynamic stuff
		for(i=0;i<oldlist.Size();i++)
		{
			F3DFloor * rover=oldlist[i];

			if (rover->flags&FF_DYNAMIC)
			{
				delete rover;
				oldlist.Delete(i);
				i--;
				continue;
			}
			if (rover->flags&FF_CLIPPED)
			{
				rover->flags&=~FF_CLIPPED;
				rover->flags|=FF_EXISTS;
			}
		}

		while (oldlist.Size())
		{
			pick=oldlist[0];
			double height=pick->top.plane->ZatPoint(sector->centerspot);

			// find highest starting ffloor - intersections are not supported!
			pickindex=0;
			for (j=1;j<oldlist.Size();j++)
			{
				double h2=oldlist[j]->top.plane->ZatPoint(sector->centerspot);

				if (h2>height)
				{
					pick=oldlist[j];
					pickindex=j;
					height=h2;
				}
			}

			oldlist.Delete(pickindex);
			double pick_bottom=pick->bottom.plane->ZatPoint(sector->centerspot);

			if (pick->flags & FF_THISINSIDE)
			{
				// These have the floor higher than the ceiling and cannot be processed
				// by the clipping code below.
				ffloors.Push(pick);
			}
			else if ((pick->flags&(FF_SWIMMABLE|FF_TRANSLUCENT) || (!(pick->flags&FF_RENDERALL))) && pick->flags&FF_EXISTS)
			{
				// We must check if this nonsolid segment gets clipped from the top by another 3D floor
				if (solid != NULL && solid_bottom < height)
				{
					ffloors.Push(pick);
					if (solid_bottom < pick_bottom)
					{
						// this one is fully covered
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
					}
					else
					{
						F3DFloor * dyn=new F3DFloor;
						*dyn=*pick;
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
						dyn->flags|=FF_DYNAMIC;
						dyn->top.copyPlane(&solid->bottom);
						ffloors.Push(dyn);

						clipped = dyn;
						clipped_top = solid_bottom;
						clipped_bottom = pick_bottom;
					}
				}
				else if (pick_bottom > height)	// do not allow inverted planes
				{
					F3DFloor * dyn = new F3DFloor;
					*dyn = *pick;
					pick->flags |= FF_CLIPPED;
					pick->flags &= ~FF_EXISTS;
					dyn->flags |= FF_DYNAMIC;
					dyn->bottom.copyPlane(&pick->top);
					ffloors.Push(pick);
					ffloors.Push(dyn);
				}
				else
				{
					clipped = pick;
					clipped_top = height;
					clipped_bottom = pick_bottom;
					ffloors.Push(pick);
				}
			}
			else if (clipped && clipped_bottom<height)
			{
				// translucent floor above must be clipped to this one!
				F3DFloor * dyn=new F3DFloor;
				*dyn=*clipped;
				clipped->flags|=FF_CLIPPED;
				clipped->flags&=~FF_EXISTS;
				dyn->flags|=FF_DYNAMIC;
				dyn->bottom.copyPlane(&pick->top);
				ffloors.Push(dyn);
				ffloors.Push(pick);

				if (pick_bottom<=clipped_bottom)
				{
					clipped=NULL;
				}
				else
				{
					// the translucent part extends below the clipper
					dyn=new F3DFloor;
					*dyn=*clipped;
					dyn->flags|=FF_DYNAMIC|FF_EXISTS;
					dyn->top.copyPlane(&pick->bottom);
					ffloors.Push(dyn);
					clipped = dyn;
					clipped_top = pick_bottom;
				}
				solid = pick;
				solid_bottom = pick_bottom;
			}
			else
			{
				clipped = NULL;
				if (solid == NULL || solid_bottom > pick_bottom)
				{
					// only if this one is lower
					solid = pick;
					solid_bottom = pick_bottom;
				}
				ffloors.Push(pick);

			}

		}
	}

	// having the floors sorted makes this routine significantly simpler
	// Only some overlapping cases with FF_DOUBLESHADOW might create anomalies
	// but these are clearly undefined.
	if(ffloors.Size())
	{
		lightlist.Resize(1);
		lightlist[0].plane = sector->ceilingplane;
		lightlist[0].p_lightlevel = &sector->lightlevel;
		lightlist[0].caster = NULL;
		lightlist[0].lightsource = NULL;
		lightlist[0].extra_colormap = sector->ColorMap;
		lightlist[0].blend = 0;
		lightlist[0].flags = 0;

		resetlight = lightlist[0];

		maxheight = sector->ceilingplane.ZatPoint(sector->centerspot);
		minheight = sector->floorplane.ZatPoint(sector->centerspot);
		for(i = 0; i < ffloors.Size(); i++)
		{
			rover=ffloors[i];

			if ( !(rover->flags & FF_EXISTS) || rover->flags & FF_NOSHADE )
				continue;
				
			double ff_top=rover->top.plane->ZatPoint(sector->centerspot);
			if (ff_top < minheight) break;	// reached the floor
			if (ff_top < maxheight)
			{
				newlight.plane = *rover->top.plane;
				newlight.p_lightlevel = rover->toplightlevel;
				newlight.caster = rover;
				newlight.lightsource = rover;
				newlight.extra_colormap = rover->GetColormap();
				newlight.blend = rover->GetBlend();
				newlight.flags = rover->flags;
				lightlist.Push(newlight);
			}
			else
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if (ff_bottom<maxheight)
				{
					// this segment begins over the ceiling and extends beyond it
					lightlist[0].p_lightlevel = rover->toplightlevel;
					lightlist[0].caster = rover;
					lightlist[0].lightsource = rover;
					lightlist[0].extra_colormap = rover->GetColormap();
					lightlist[0].blend = rover->GetBlend();
					lightlist[0].flags = rover->flags;
				}
			}
			if (!(rover->flags & (FF_DOUBLESHADOW | FF_RESET)))
			{
				resetlight = lightlist.Last();
			}
			else if (rover->flags & FF_RESET)
			{
				resetlight.p_lightlevel = &sector->lightlevel;
				resetlight.lightsource = NULL;
				resetlight.extra_colormap = sector->ColorMap;
				resetlight.blend = 0;
			}

			if (rover->flags&FF_DOUBLESHADOW)
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if(ff_bottom < maxheight && ff_bottom>minheight)
				{
					newlight.caster = rover;
					newlight.plane = *rover->bottom.plane;
					newlight.lightsource = resetlight.lightsource;
					newlight.p_lightlevel = resetlight.p_lightlevel;
					newlight.extra_colormap = resetlight.extra_colormap;
					newlight.blend = resetlight.blend;
					newlight.flags = rover->flags;
					lightlist.Push(newlight);
				}
			}
		}
	}
}